

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswDyn.c
# Opt level: O1

int Ssw_ManSweepDyn(Ssw_Man_t *p)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Aig_Man_t *pAVar6;
  Aig_Obj_t *pAVar7;
  void **ppvVar8;
  void **ppvVar9;
  Vec_Ptr_t *pVVar10;
  Bar_Progress_t *p_00;
  ulong uVar11;
  Ssw_Sat_t *pSVar12;
  void **ppvVar13;
  long lVar14;
  Aig_Obj_t *p1;
  anon_union_8_2_c1dd1440_for_Aig_Obj_t__0 *paVar15;
  Aig_Obj_t *pAVar16;
  long lVar17;
  ulong uVar18;
  timespec ts;
  anon_union_8_2_c1dd1440_for_Aig_Obj_t__0 local_38;
  long local_30;
  
  paVar15 = &local_38;
  iVar2 = clock_gettime(3,(timespec *)&local_38);
  if (iVar2 < 0) {
    lVar14 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30),8);
    lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + (long)local_38.pNext * -1000000;
  }
  pAVar6 = Ssw_FramesWithClasses(p);
  p->pFrames = pAVar6;
  Aig_ManFanoutStart(pAVar6);
  p->nSRMiterMaxId = p->pFrames->vObjs->nSize;
  iVar2 = p->pPars->nFramesK;
  p->pNodeToFrames[p->pAig->pConst1->Id * p->nFrames + iVar2] = p->pFrames->pConst1;
  pAVar6 = p->pAig;
  if (0 < pAVar6->nTruePis) {
    lVar17 = 0;
    do {
      if (pAVar6->vCis->nSize <= lVar17) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = pAVar6->vCis->pArray[lVar17];
      pAVar7 = Aig_ObjCreateCi(p->pFrames);
      p->pNodeToFrames[*(int *)((long)pvVar1 + 0x24) * p->nFrames + iVar2] = pAVar7;
      lVar17 = lVar17 + 1;
      pAVar6 = p->pAig;
    } while (lVar17 < pAVar6->nTruePis);
  }
  Aig_ManSetCioIds(p->pFrames);
  Ssw_ManLabelPiNodes(p);
  iVar3 = clock_gettime(3,(timespec *)&local_38);
  if (iVar3 < 0) {
    lVar17 = -1;
  }
  else {
    lVar17 = local_30 / 1000 + (long)local_38.pNext * 1000000;
  }
  p->timeReduce = p->timeReduce + lVar17 + lVar14;
  if (p->vSimInfo != (Vec_Ptr_t *)0x0) {
    __assert_fail("p->vSimInfo == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswDyn.c"
                  ,0x18e,"int Ssw_ManSweepDyn(Ssw_Man_t *)");
  }
  iVar3 = p->pFrames->nObjs[2];
  lVar14 = (long)iVar3;
  ppvVar8 = (void **)malloc(lVar14 * 0xc);
  if (0 < lVar14) {
    ppvVar9 = ppvVar8 + lVar14;
    ppvVar13 = ppvVar8;
    do {
      *ppvVar13 = ppvVar9;
      ppvVar13 = ppvVar13 + 1;
      ppvVar9 = (void **)((long)ppvVar9 + 4);
      lVar14 = lVar14 + -1;
    } while (lVar14 != 0);
  }
  pVVar10 = (Vec_Ptr_t *)malloc(0x10);
  pVVar10->nSize = iVar3;
  pVVar10->nCap = iVar3;
  pVVar10->pArray = ppvVar8;
  p->vSimInfo = pVVar10;
  if (0 < iVar3) {
    lVar14 = 0;
    do {
      *(undefined4 *)pVVar10->pArray[lVar14] = 0;
      lVar14 = lVar14 + 1;
    } while (lVar14 < pVVar10->nSize);
  }
  p->fRefined = 0;
  Ssw_ClassesClearRefined(p->ppClasses);
  uVar18 = 0;
  if (p->pPars->fVerbose == 0) {
    p_00 = (Bar_Progress_t *)0x0;
  }
  else {
    uVar4 = p->pAig->vObjs->nSize;
    paVar15 = (anon_union_8_2_c1dd1440_for_Aig_Obj_t__0 *)(ulong)uVar4;
    p_00 = Bar_ProgressStart(_stdout,uVar4);
  }
  iVar3 = (int)paVar15;
  p->iNodeStart = 0;
  pVVar10 = p->pAig->vObjs;
  if (0 < pVVar10->nSize) {
    uVar18 = 0;
    do {
      pAVar7 = (Aig_Obj_t *)pVVar10->pArray[uVar18];
      if (pAVar7 != (Aig_Obj_t *)0x0) {
        iVar3 = (int)uVar18;
        if (p->iNodeStart == 0) {
          p->iNodeStart = iVar3;
        }
        if ((p->pPars->fVerbose != 0) &&
           ((p_00 == (Bar_Progress_t *)0x0 || ((long)p_00->nItemsNext <= (long)uVar18)))) {
          paVar15 = (anon_union_8_2_c1dd1440_for_Aig_Obj_t__0 *)(uVar18 & 0xffffffff);
          Bar_ProgressUpdate_int(p_00,iVar3,(char *)0x0);
        }
        uVar4 = (uint)*(undefined8 *)&pAVar7->field_0x18;
        if (((uVar4 & 7) == 2) && (p->pAig->nTruePis <= (pAVar7->field_0).CioId)) {
LAB_006119df:
          uVar4 = Ssw_ManSweepNode(p,pAVar7,iVar2,0,(Vec_Int_t *)0x0);
          p->fRefined = p->fRefined | uVar4;
          paVar15 = &pAVar7->field_0;
        }
        else if (0xfffffffd < (uVar4 & 7) - 7) {
          if (((ulong)pAVar7 & 1) != 0) {
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswInt.h"
                          ,0xb9,"Aig_Obj_t *Ssw_ObjChild0Fra(Ssw_Man_t *, Aig_Obj_t *, int)");
          }
          uVar11 = (ulong)pAVar7->pFanin0 & 0xfffffffffffffffe;
          if (uVar11 == 0) {
            pAVar16 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar16 = (Aig_Obj_t *)
                      ((ulong)((uint)pAVar7->pFanin0 & 1) ^
                      (ulong)p->pNodeToFrames[*(int *)(uVar11 + 0x24) * p->nFrames + iVar2]);
          }
          uVar11 = (ulong)pAVar7->pFanin1 & 0xfffffffffffffffe;
          if (uVar11 == 0) {
            p1 = (Aig_Obj_t *)0x0;
          }
          else {
            p1 = (Aig_Obj_t *)
                 ((ulong)((uint)pAVar7->pFanin1 & 1) ^
                 (ulong)p->pNodeToFrames[*(int *)(uVar11 + 0x24) * p->nFrames + iVar2]);
          }
          pAVar16 = Aig_And(p->pFrames,pAVar16,p1);
          p->pNodeToFrames[pAVar7->Id * p->nFrames + iVar2] = pAVar16;
          goto LAB_006119df;
        }
        if (p->pMSat->pSat == (sat_solver *)0x0) {
LAB_00611a28:
          if (0 < p->nPatterns) {
            p->iNodeLast = iVar3;
            if (p->pPars->fLocalSim == 0) {
              Ssw_ManSweepResimulateDyn(p,(int)paVar15);
            }
            else {
              Ssw_ManSweepResimulateDynLocal(p,(int)paVar15);
            }
            p->iNodeStart = iVar3 + 1;
          }
          Aig_ManCleanMarkAB(p->pFrames);
          Ssw_ManLabelPiNodes(p);
          pSVar12 = p->pMSat;
          if (pSVar12 != (Ssw_Sat_t *)0x0) {
            iVar5 = pSVar12->nSatVars;
            if (pSVar12->nSatVars < p->nVarsMax) {
              iVar5 = p->nVarsMax;
            }
            p->nVarsMax = iVar5;
            iVar5 = pSVar12->nSolverCalls;
            if (pSVar12->nSolverCalls < p->nCallsMax) {
              iVar5 = p->nCallsMax;
            }
            p->nCallsMax = iVar5;
            Ssw_SatStop(pSVar12);
            p->nRecycles = p->nRecycles + 1;
            p->nRecyclesTotal = p->nRecyclesTotal + 1;
            p->nRecycleCalls = 0;
          }
          pSVar12 = Ssw_SatStart(0);
          p->pMSat = pSVar12;
          if (p->nPatterns != 0) {
            __assert_fail("p->nPatterns == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswDyn.c"
                          ,0x1c7,"int Ssw_ManSweepDyn(Ssw_Man_t *)");
          }
        }
        else {
          iVar5 = p->pPars->nSatVarMax2;
          if (((iVar5 != 0) && (iVar5 < p->pMSat->nSatVars)) &&
             (p->pPars->nRecycleCalls2 < p->nRecycleCalls)) goto LAB_00611a28;
        }
        if (p->nPatterns == 0x20) {
          p->iNodeLast = iVar3;
          if (p->pPars->fLocalSim == 0) {
            Ssw_ManSweepResimulateDyn(p,(int)paVar15);
          }
          else {
            Ssw_ManSweepResimulateDynLocal(p,(int)paVar15);
          }
          p->iNodeStart = iVar3 + 1;
        }
      }
      iVar3 = (int)paVar15;
      uVar18 = uVar18 + 1;
      pVVar10 = p->pAig->vObjs;
    } while ((long)uVar18 < (long)pVVar10->nSize);
  }
  if (0 < p->nPatterns) {
    p->iNodeLast = (int)uVar18;
    if (p->pPars->fLocalSim == 0) {
      Ssw_ManSweepResimulateDyn(p,iVar3);
    }
    else {
      Ssw_ManSweepResimulateDynLocal(p,iVar3);
    }
  }
  if (p->pPars->fVerbose != 0) {
    Bar_ProgressStop(p_00);
  }
  return p->fRefined;
}

Assistant:

int Ssw_ManSweepDyn( Ssw_Man_t * p )
{
    Bar_Progress_t * pProgress = NULL;
    Aig_Obj_t * pObj, * pObjNew;
    int i, f;
    abctime clk;

    // perform speculative reduction
clk = Abc_Clock();
    // create timeframes
    p->pFrames = Ssw_FramesWithClasses( p );
    Aig_ManFanoutStart( p->pFrames );
    p->nSRMiterMaxId = Aig_ManObjNumMax( p->pFrames );

    // map constants and PIs of the last frame
    f = p->pPars->nFramesK;
    Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), f, Aig_ManConst1(p->pFrames) );
    Saig_ManForEachPi( p->pAig, pObj, i )
        Ssw_ObjSetFrame( p, pObj, f, Aig_ObjCreateCi(p->pFrames) );
    Aig_ManSetCioIds( p->pFrames );
    // label nodes corresponding to primary inputs
    Ssw_ManLabelPiNodes( p );
p->timeReduce += Abc_Clock() - clk;

    // prepare simulation info
    assert( p->vSimInfo == NULL );
    p->vSimInfo = Vec_PtrAllocSimInfo( Aig_ManCiNum(p->pFrames), 1 );
    Vec_PtrCleanSimInfo( p->vSimInfo, 0, 1 );

    // sweep internal nodes
    p->fRefined = 0;
    Ssw_ClassesClearRefined( p->ppClasses );
    if ( p->pPars->fVerbose )
        pProgress = Bar_ProgressStart( stdout, Aig_ManObjNumMax(p->pAig) );
    p->iNodeStart = 0;
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( p->iNodeStart == 0 )
            p->iNodeStart = i;
        if ( p->pPars->fVerbose )
            Bar_ProgressUpdate( pProgress, i, NULL );
        if ( Saig_ObjIsLo(p->pAig, pObj) )
            p->fRefined |= Ssw_ManSweepNode( p, pObj, f, 0, NULL );
        else if ( Aig_ObjIsNode(pObj) )
        {
            pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
            p->fRefined |= Ssw_ManSweepNode( p, pObj, f, 0, NULL );
        }
        // check if it is time to recycle the solver
        if ( p->pMSat->pSat == NULL ||
            (p->pPars->nSatVarMax2 &&
             p->pMSat->nSatVars > p->pPars->nSatVarMax2 &&
             p->nRecycleCalls > p->pPars->nRecycleCalls2) )
        {
            // resimulate
            if ( p->nPatterns > 0 )
            {
                p->iNodeLast = i;
                if ( p->pPars->fLocalSim )
                    Ssw_ManSweepResimulateDynLocal( p, f );
                else
                    Ssw_ManSweepResimulateDyn( p, f );
                p->iNodeStart = i+1;
            }
//                Abc_Print( 1, "Recycling SAT solver with %d vars and %d calls.\n", 
//                    p->pMSat->nSatVars, p->nRecycleCalls );
//            Aig_ManCleanMarkAB( p->pAig );
            Aig_ManCleanMarkAB( p->pFrames );
            // label nodes corresponding to primary inputs
            Ssw_ManLabelPiNodes( p );
            // replace the solver
            if ( p->pMSat )
            {
                p->nVarsMax  = Abc_MaxInt( p->nVarsMax,  p->pMSat->nSatVars );
                p->nCallsMax = Abc_MaxInt( p->nCallsMax, p->pMSat->nSolverCalls );
                Ssw_SatStop( p->pMSat );
                p->nRecycles++;
                p->nRecyclesTotal++;
                p->nRecycleCalls = 0;
            }
            p->pMSat = Ssw_SatStart( 0 );
            assert( p->nPatterns == 0 );
        }
        // resimulate
        if ( p->nPatterns == 32 )
        {
            p->iNodeLast = i;
            if ( p->pPars->fLocalSim )
                Ssw_ManSweepResimulateDynLocal( p, f );
            else
                Ssw_ManSweepResimulateDyn( p, f );
            p->iNodeStart = i+1;
        }
    }
    // resimulate
    if ( p->nPatterns > 0 )
    {
        p->iNodeLast = i;
        if ( p->pPars->fLocalSim )
            Ssw_ManSweepResimulateDynLocal( p, f );
        else
            Ssw_ManSweepResimulateDyn( p, f );
    }
    // collect stats
    if ( p->pPars->fVerbose )
        Bar_ProgressStop( pProgress );

    // cleanup
//    Ssw_ClassesCheck( p->ppClasses );
    return p->fRefined;
}